

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

bool __thiscall
QSQLiteDriverPrivate::isIdentifierEscaped(QSQLiteDriverPrivate *this,QStringView identifier)

{
  storage_type sVar1;
  storage_type *psVar2;
  long lVar3;
  
  psVar2 = identifier.m_data;
  lVar3 = identifier.m_size;
  if (lVar3 < 3) {
    return false;
  }
  sVar1 = *psVar2;
  if (sVar1 == L'`') {
    if (psVar2[lVar3 + -1] != L'`') {
      return false;
    }
  }
  else {
    if (sVar1 == L'[') {
      return psVar2[lVar3 + -1] == L']';
    }
    if (sVar1 != L'\"') {
      return false;
    }
    if (psVar2[lVar3 + -1] != L'\"') {
      return false;
    }
  }
  return true;
}

Assistant:

bool QSQLiteDriverPrivate::isIdentifierEscaped(QStringView identifier) const
{
    return identifier.size() > 2
            && ((identifier.startsWith(u'"') && identifier.endsWith(u'"'))
                || (identifier.startsWith(u'`') && identifier.endsWith(u'`'))
                || (identifier.startsWith(u'[') && identifier.endsWith(u']')));
}